

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  Gap *pGVar1;
  long lVar2;
  Error EVar3;
  Node *pNVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t offset;
  void *data_00;
  bool bVar10;
  long lStack_60;
  
  EVar3 = 2;
  switch(size) {
  case 1:
    lStack_60 = 0;
    break;
  case 2:
    lStack_60 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_001121c3_caseD_3;
  case 4:
    lStack_60 = 2;
    break;
  case 8:
    lStack_60 = 3;
    break;
  default:
    if (size == 0x20) {
      lStack_60 = 5;
    }
    else {
      if (size != 0x10) {
        return 2;
      }
      lStack_60 = 4;
    }
  }
  pNVar4 = Tree::get(this->_tree + lStack_60,data);
  if (pNVar4 == (Node *)0x0) {
    offset = 0xffffffffffffffff;
    for (lVar9 = lStack_60 + -5; lVar9 != 0; lVar9 = lVar9 + 1) {
      pGVar1 = this->_gaps[lStack_60];
      if (pGVar1 != (Gap *)0x0) {
        offset = pGVar1->_offset;
        sVar6 = pGVar1->_size;
        this->_gaps[lStack_60] = pGVar1->_next;
        pGVar1->_next = this->_gapPool;
        this->_gapPool = pGVar1;
        if (offset % size != 0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/constpool.cpp"
                     ,0xa3,"Support::isAligned<size_t>(offset, size)");
        }
        sVar6 = sVar6 - size;
        if (sVar6 != 0) {
          ConstPool_addGap(this,offset,sVar6);
        }
      }
    }
    if (offset == 0xffffffffffffffff) {
      offset = this->_size;
      sVar6 = (-size & (size + offset) - 1) - offset;
      if (sVar6 != 0) {
        ConstPool_addGap(this,offset,sVar6);
        offset = sVar6 + this->_size;
      }
      this->_size = offset + size;
    }
    pNVar4 = Tree::_newNode(this->_zone,data,size,offset,false);
    if (pNVar4 == (Node *)0x0) {
      return 1;
    }
    Tree::insert(this->_tree + lStack_60,pNVar4);
    uVar5 = this->_alignment;
    if (this->_alignment <= size) {
      uVar5 = size;
    }
    this->_alignment = uVar5;
    *dstOffset = offset;
    lVar9 = 1;
    while (4 < size) {
      lVar8 = lStack_60 + -1;
      if (lStack_60 == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/constpool.cpp"
                   ,0xcc,"treeIndex != 0");
      }
      size = size >> 1;
      lVar9 = lVar9 * 2;
      lVar2 = lStack_60 + -1;
      lVar7 = lVar9;
      sVar6 = offset;
      data_00 = data;
      while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, lStack_60 = lVar8, bVar10) {
        pNVar4 = Tree::get(this->_tree + lVar2,data_00);
        if (pNVar4 == (Node *)0x0) {
          pNVar4 = Tree::_newNode(this->_zone,data_00,size,sVar6,true);
          Tree::insert(this->_tree + lVar2,pNVar4);
        }
        data_00 = (void *)((long)data_00 + size);
        sVar6 = sVar6 + size;
      }
    }
  }
  else {
    *dstOffset = (ulong)pNVar4->_offset;
  }
  EVar3 = 0;
switchD_001121c3_caseD_3:
  return EVar3;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].insert(node);
    }
  }

  return kErrorOk;
}